

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

InfoInserzione __thiscall
ADE_DEP_DPFSP::miglioreInserzione
          (ADE_DEP_DPFSP *this,unsigned_short *vettoreFabbrica,
          unsigned_short dimensioneVettoreFabbrica,unsigned_short lavoroDaInserire)

{
  undefined1 auVar1 [16];
  InfoInserzione IVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  uint *puVar6;
  ushort local_62;
  uint local_60;
  unsigned_short i_2;
  uint local_58;
  ushort local_54;
  unsigned_short j_2;
  uint makeSpanParziale;
  unsigned_short j_1;
  unsigned_short i_1;
  int j;
  int i;
  unsigned_short migliorePosizione;
  void *pvStack_40;
  uint miglioreMakespan;
  uint **q;
  uint *f;
  uint *e;
  unsigned_short fabbrica [1];
  unsigned_short lavoroDaInserire_local;
  unsigned_short *puStack_20;
  unsigned_short dimensioneVettoreFabbrica_local;
  unsigned_short *vettoreFabbrica_local;
  ADE_DEP_DPFSP *this_local;
  
  e._4_2_ = lavoroDaInserire;
  e._6_2_ = dimensioneVettoreFabbrica;
  puStack_20 = vettoreFabbrica;
  if (dimensioneVettoreFabbrica == 0) {
    e._2_2_ = lavoroDaInserire;
    this_local._0_4_ = valutaIndividuoParziale(this,(unsigned_short *)((long)&e + 2),1);
    this_local._4_2_ = 0;
  }
  else {
    auVar1 = ZEXT216((this->istanza).macchine) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    f = (uint *)operator_new__(uVar4);
    auVar1 = ZEXT216((this->istanza).macchine) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    q = (uint **)operator_new__(uVar4);
    auVar1 = ZEXT216((this->istanza).lavori) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvStack_40 = operator_new__(uVar4);
    i = -1;
    j._2_2_ = 0;
    _j_1 = (uint)e._6_2_;
    while (_j_1 = _j_1 - 1, -1 < (int)_j_1) {
      auVar1 = ZEXT216((this->istanza).macchine) * ZEXT816(4);
      uVar4 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pvVar5 = operator_new__(uVar4);
      *(void **)((long)pvStack_40 + (long)(int)_j_1 * 8) = pvVar5;
      uVar3 = (uint)(this->istanza).macchine;
      while (makeSpanParziale = uVar3 - 1, -1 < (int)makeSpanParziale) {
        if ((_j_1 == e._6_2_ - 1) || (makeSpanParziale == (this->istanza).macchine - 1)) {
          if ((_j_1 == e._6_2_ - 1) && (makeSpanParziale != (this->istanza).macchine - 1)) {
            *(uint *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) +
                     (long)(int)makeSpanParziale * 4) =
                 *(int *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) + (long)(int)uVar3 * 4)
                 + (this->istanza).p[puStack_20[(int)_j_1]][(int)makeSpanParziale];
            uVar3 = makeSpanParziale;
          }
          else if ((_j_1 == e._6_2_ - 1) || (makeSpanParziale != (this->istanza).macchine - 1)) {
            *(uint *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) +
                     (long)(int)makeSpanParziale * 4) =
                 (this->istanza).p[puStack_20[(int)_j_1]][(int)makeSpanParziale];
            uVar3 = makeSpanParziale;
          }
          else {
            *(uint *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) +
                     (long)(int)makeSpanParziale * 4) =
                 *(int *)(*(long *)((long)pvStack_40 + (long)(int)(_j_1 + 1) * 8) +
                         (long)(int)makeSpanParziale * 4) +
                 (this->istanza).p[puStack_20[(int)_j_1]][(int)makeSpanParziale];
            uVar3 = makeSpanParziale;
          }
        }
        else {
          puVar6 = std::max<unsigned_int>
                             ((uint *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) +
                                      (long)(int)uVar3 * 4),
                              (uint *)(*(long *)((long)pvStack_40 + (long)(int)(_j_1 + 1) * 8) +
                                      (long)(int)makeSpanParziale * 4));
          *(uint *)(*(long *)((long)pvStack_40 + (long)(int)_j_1 * 8) +
                   (long)(int)makeSpanParziale * 4) =
               *puVar6 + (this->istanza).p[puStack_20[(int)_j_1]][(int)makeSpanParziale];
          uVar3 = makeSpanParziale;
        }
      }
    }
    for (j_2 = 0; j_2 <= e._6_2_; j_2 = j_2 + 1) {
      for (local_54 = 0; local_54 < (this->istanza).macchine; local_54 = local_54 + 1) {
        if ((j_2 == 0) && (local_54 == 0)) {
          *(uint *)q = *(this->istanza).p[e._4_2_];
          *f = *(this->istanza).p[*puStack_20];
        }
        else if ((j_2 == 0) || (local_54 != 0)) {
          if ((j_2 == 0) && (local_54 != 0)) {
            *(uint *)((long)q + (ulong)local_54 * 4) =
                 *(int *)((long)q + (long)(int)(local_54 - 1) * 4) +
                 (this->istanza).p[e._4_2_][local_54];
            f[local_54] = f[(int)(local_54 - 1)] + (this->istanza).p[*puStack_20][local_54];
          }
          else {
            puVar6 = std::max<unsigned_int>
                               ((uint *)((long)q + (long)(int)(local_54 - 1) * 4),f + local_54);
            *(uint *)((long)q + (ulong)local_54 * 4) =
                 *puVar6 + (this->istanza).p[e._4_2_][local_54];
            if (j_2 != e._6_2_) {
              puVar6 = std::max<unsigned_int>(f + (int)(local_54 - 1),f + local_54);
              f[local_54] = *puVar6 + (this->istanza).p[puStack_20[j_2]][local_54];
            }
          }
        }
        else {
          *(uint *)q = *f + *(this->istanza).p[e._4_2_];
          if (j_2 != e._6_2_) {
            *f = *f + *(this->istanza).p[puStack_20[j_2]];
          }
        }
      }
      local_58 = 0;
      for (i_2 = 0; i_2 < (this->istanza).macchine; i_2 = i_2 + 1) {
        if (j_2 == e._6_2_) {
          puVar6 = std::max<unsigned_int>(&local_58,(uint *)((long)q + (ulong)i_2 * 4));
          local_58 = *puVar6;
        }
        else {
          local_60 = *(int *)((long)q + (ulong)i_2 * 4) +
                     *(int *)(*(long *)((long)pvStack_40 + (ulong)j_2 * 8) + (ulong)i_2 * 4);
          puVar6 = std::max<unsigned_int>(&local_58,&local_60);
          local_58 = *puVar6;
        }
      }
      if (local_58 < (uint)i) {
        i = local_58;
        j._2_2_ = j_2;
      }
    }
    if (f != (uint *)0x0) {
      operator_delete__(f);
    }
    if (q != (uint **)0x0) {
      operator_delete__(q);
    }
    for (local_62 = 0; local_62 < e._6_2_; local_62 = local_62 + 1) {
      pvVar5 = *(void **)((long)pvStack_40 + (ulong)local_62 * 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
    }
    if (pvStack_40 != (void *)0x0) {
      operator_delete__(pvStack_40);
    }
    this_local._0_4_ = i;
    this_local._4_2_ = j._2_2_;
  }
  IVar2.posizione = this_local._4_2_;
  IVar2.makeSpan = (uint)this_local;
  IVar2._6_2_ = this_local._6_2_;
  return IVar2;
}

Assistant:

ADE_DEP_DPFSP::InfoInserzione ADE_DEP_DPFSP::miglioreInserzione(unsigned short* vettoreFabbrica, 
	unsigned short dimensioneVettoreFabbrica,
	unsigned short lavoroDaInserire) {

	if (dimensioneVettoreFabbrica == 0) {
		unsigned short fabbrica[1] = { lavoroDaInserire };
		return { valutaIndividuoParziale(fabbrica, 1) , 0};
	}
		
	//Accelerazione di Taillard, guardare l'articolo relativo
	unsigned int* e = new unsigned int[istanza.macchine];
	unsigned int* f = new unsigned int[istanza.macchine];
	unsigned int** q = new unsigned int* [istanza.lavori];

	unsigned int miglioreMakespan = UINT32_MAX;
	unsigned short migliorePosizione = 0;

	for (int i = dimensioneVettoreFabbrica - 1; i >= 0; i--) {
		q[i] = new unsigned int[istanza.macchine];

		for (int j = istanza.macchine - 1; j >= 0; j--) {

			if (i != dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = max(q[i][j + 1], q[i + 1][j]) + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i == dimensioneVettoreFabbrica - 1 && j != istanza.macchine - 1) {
				q[i][j] = q[i][j + 1] + istanza.p[vettoreFabbrica[i]][j];
			}
			else if (i != dimensioneVettoreFabbrica - 1 && j == istanza.macchine - 1) {
				q[i][j] = q[i + 1][j] + istanza.p[vettoreFabbrica[i]][j];
			}
			else {
				q[i][j] = istanza.p[vettoreFabbrica[i]][j];
			}	
		}
	}

	for (unsigned short i = 0; i <= dimensioneVettoreFabbrica; i++) {

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i == 0 && j == 0) {
				f[0] = istanza.p[lavoroDaInserire][0];
				e[0] = istanza.p[vettoreFabbrica[0]][0];
			}
			else if (i != 0 && j == 0) {
				f[0] = e[0] + istanza.p[lavoroDaInserire][0];

				if (i != dimensioneVettoreFabbrica)
					e[0] = e[0] + istanza.p[vettoreFabbrica[i]][0];
			}
			else if (i == 0 && j != 0) {
				f[j] = f[j - 1] + istanza.p[lavoroDaInserire][j];
				e[j] = e[j - 1] + istanza.p[vettoreFabbrica[0]][j];
			}
			else {
				f[j] = max(f[j - 1], e[j]) + istanza.p[lavoroDaInserire][j];
				if (i != dimensioneVettoreFabbrica)
					e[j] = max(e[j - 1], e[j]) + istanza.p[vettoreFabbrica[i]][j];
			}
		}

		unsigned int makeSpanParziale = 0;

		for (unsigned short j = 0; j < istanza.macchine; j++) {

			if (i != dimensioneVettoreFabbrica)
				makeSpanParziale = max(makeSpanParziale, f[j] + q[i][j]);
			else
				makeSpanParziale = max(makeSpanParziale, f[j]);
		}

		if (makeSpanParziale < miglioreMakespan) {
			miglioreMakespan = makeSpanParziale;
			migliorePosizione = i;
		}

	}

	delete[] e;
	delete[] f;

	for (unsigned short i = 0; i < dimensioneVettoreFabbrica; i++) {
		delete[] q[i];
	}

	delete[] q;

	return { miglioreMakespan, migliorePosizione };
}